

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_commit.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::commit_in_bg(raft_server *this)

{
  anon_class_8_1_8991fb9c __p;
  int iVar1;
  pthread_t __target_thread;
  char *__name;
  __int_type _Var2;
  __int_type _Var3;
  element_type *peVar4;
  undefined4 extraout_var;
  element_type *peVar5;
  long in_RDI;
  bool bVar6;
  exception *err;
  unique_lock<std::mutex> lock2;
  anon_class_8_1_8991fb9c wait_check;
  unique_lock<std::mutex> lock;
  string thread_name;
  size_t in_stack_000003c0;
  raft_server *in_stack_000003c8;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  unique_lock<std::mutex> *in_stack_fffffffffffffec0;
  condition_variable *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  string local_a0 [32];
  long local_80;
  string local_78 [32];
  long local_58;
  unique_lock<std::mutex> local_50 [2];
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"nuraft_commit",&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  __target_thread = pthread_self();
  __name = (char *)std::__cxx11::string::c_str();
  pthread_setname_np(__target_thread,__name);
  do {
    while( true ) {
      _Var2 = std::__atomic_base::operator_cast_to_unsigned_long
                        ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffec8);
      _Var3 = std::__atomic_base::operator_cast_to_unsigned_long
                        ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffec8);
      bVar6 = true;
      if (_Var3 < _Var2) {
        _Var2 = std::__atomic_base::operator_cast_to_unsigned_long
                          ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffec8);
        peVar4 = std::
                 __shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x26366f);
        iVar1 = (*peVar4->_vptr_log_store[2])();
        bVar6 = CONCAT44(extraout_var,iVar1) - 1U <= _Var2;
      }
      if (bVar6) break;
      commit_in_bg_exec(in_stack_000003c8,in_stack_000003c0);
    }
    std::unique_lock<std::mutex>::unique_lock
              (in_stack_fffffffffffffec0,
               (mutex_type *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
    local_58 = in_RDI;
    bVar6 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar6) {
      peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2636f5);
      iVar1 = (*peVar5->_vptr_logger[7])();
      if (5 < iVar1) {
        peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x263725);
        msg_if_given_abi_cxx11_((char *)local_78,"commit_cv_ sleep\n");
        (*peVar5->_vptr_logger[8])
                  (peVar5,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                   ,"commit_in_bg",0x7b,local_78);
        std::__cxx11::string::~string(local_78);
      }
    }
    local_80 = local_58;
    __p.this._4_4_ = in_stack_fffffffffffffed4;
    __p.this._0_4_ = in_stack_fffffffffffffed0;
    std::condition_variable::wait<nuraft::raft_server::commit_in_bg()::__0>
              (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,__p);
    bVar6 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar6) {
      peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x26385e);
      in_stack_fffffffffffffed4 = (*peVar5->_vptr_logger[7])();
      if (5 < in_stack_fffffffffffffed4) {
        in_stack_fffffffffffffec8 =
             (condition_variable *)
             std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x26388e);
        msg_if_given_abi_cxx11_((char *)local_a0,"commit_cv_ wake up\n");
        (**(_func_int **)(*(__int_type *)in_stack_fffffffffffffec8 + 0x40))
                  (in_stack_fffffffffffffec8,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                   ,"commit_in_bg",0x7e,local_a0);
        std::__cxx11::string::~string(local_a0);
      }
    }
    bVar6 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffec8);
    if (bVar6) {
      std::unique_lock<std::mutex>::unlock(in_stack_fffffffffffffec0);
      std::unique_lock<std::mutex>::release(local_50);
      std::unique_lock<std::mutex>::unique_lock
                (in_stack_fffffffffffffec0,
                 (mutex_type *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
      std::condition_variable::notify_all();
      std::unique_lock<std::mutex>::~unique_lock(in_stack_fffffffffffffec0);
      std::atomic<bool>::operator=
                ((atomic<bool> *)in_stack_fffffffffffffec0,(bool)in_stack_fffffffffffffebf);
    }
    std::unique_lock<std::mutex>::~unique_lock(in_stack_fffffffffffffec0);
  } while (!bVar6);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void raft_server::commit_in_bg() {
    std::string thread_name = "nuraft_commit";
#ifdef __linux__
    pthread_setname_np(pthread_self(), thread_name.c_str());
#elif __APPLE__
    pthread_setname_np(thread_name.c_str());
#endif

    while (true) {
     try {
        while ( quick_commit_index_ <= sm_commit_index_ ||
                sm_commit_index_ >= log_store_->next_slot() - 1 ) {
            std::unique_lock<std::mutex> lock(commit_cv_lock_);

            auto wait_check = [this]() {
                if (stopping_) {
                    // WARNING: `stopping_` flag should have the highest priority.
                    return true;
                }
                if (sm_commit_paused_) {
                    return false;
                }
                return ( log_store_->next_slot() - 1 > sm_commit_index_ &&
                         quick_commit_index_ > sm_commit_index_ );
            };
            p_tr("commit_cv_ sleep\n");
            commit_cv_.wait(lock, wait_check);

            p_tr("commit_cv_ wake up\n");
            if (stopping_) {
                lock.unlock();
                lock.release();
                { std::unique_lock<std::mutex> lock2(ready_to_stop_cv_lock_);
                  ready_to_stop_cv_.notify_all(); }
                commit_bg_stopped_ = true;
                return;
            }

            // NOTE:
            //   Even though commit_cv_ is invoked (by commit()), we don't
            //   need to execute it if the current commit index number of
            //   the state machine is greater than either
            //     1) requested commit index or
            //     2) log store's latest log index.
        }

        commit_in_bg_exec();

     } catch (std::exception& err) {
        // LCOV_EXCL_START
        commit_bg_stopped_ = true;
        p_er( "background committing thread encounter err %s, "
              "exiting to protect the system",
              err.what() );
        ctx_->state_mgr_->system_exit(raft_err::N20_background_commit_err);
        ::exit(-1);
        // LCOV_EXCL_STOP
     }
    }
    commit_bg_stopped_ = true;
}